

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::float_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          float_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  char __tmp;
  ulong uVar5;
  buffer<char> *c;
  char *pcVar6;
  ulong uVar7;
  size_t size;
  char *it;
  size_t __len;
  size_t __n;
  
  uVar5 = (ulong)(uint)specs->width;
  uVar7 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar5 - uVar7;
  if (uVar5 < uVar7 || __n == 0) {
    uVar7 = uVar7 + lVar3;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    pcVar6 = (char *)(lVar3 + puVar2[1]);
    uVar7 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar7 != 0) {
      *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar7);
      pcVar6 = pcVar6 + 1;
    }
LAB_0126a901:
    float_writer<char>::prettify<char*>(f,pcVar6);
    return;
  }
  uVar5 = uVar5 + lVar3;
  if ((ulong)puVar2[3] < uVar5) {
    (**(code **)*puVar2)(puVar2,uVar5);
  }
  puVar2[2] = uVar5;
  it = (char *)(lVar3 + puVar2[1]);
  bVar1 = (specs->fill).data_[0];
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    uVar7 = __n >> 1;
    pcVar6 = it;
    if (1 < __n) {
      pcVar6 = it + uVar7;
      switchD_012e3010::default(it,(uint)bVar1,uVar7);
    }
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar5);
      pcVar6 = pcVar6 + 1;
    }
    pcVar6 = float_writer<char>::prettify<char*>(f,pcVar6);
    __n = __n - uVar7;
  }
  else {
    if (bVar4 == 2) {
      pcVar6 = it + __n;
      switchD_012e3010::default(it,(uint)bVar1,__n);
      uVar7 = (ulong)(byte)(f->specs_).field_0x5;
      if (uVar7 != 0) {
        *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar7);
        pcVar6 = pcVar6 + 1;
      }
      goto LAB_0126a901;
    }
    uVar7 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar7 != 0) {
      *it = *(char *)((long)&basic_data<void>::signs + uVar7);
      it = it + 1;
    }
    pcVar6 = float_writer<char>::prettify<char*>(f,it);
  }
  switchD_012e3010::default(pcVar6,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }